

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

Mat * IntArrayMat(int a0,int a1)

{
  int *piVar1;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  int *p;
  Mat *m;
  Allocator *in_stack_ffffffffffffffc8;
  Mat *this;
  Mat *in_stack_ffffffffffffffe0;
  
  this = in_RDI;
  ncnn::Mat::Mat(in_stack_ffffffffffffffe0,(int)((ulong)in_RDI >> 0x20),(size_t)in_RDI,
                 in_stack_ffffffffffffffc8);
  piVar1 = ncnn::Mat::operator_cast_to_int_(this);
  *piVar1 = in_ESI;
  piVar1[1] = in_EDX;
  return in_RDI;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0, int a1)
{
    ncnn::Mat m(2);
    int* p = m;
    p[0] = a0;
    p[1] = a1;
    return m;
}